

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_replace_plugin(_func_void *oldplugin,_func_void *newplugin)

{
  fsnav_plugin *pfVar1;
  char cVar2;
  fsnav_struct *pfVar3;
  long lVar4;
  ulong uVar5;
  
  if ((fsnav->core).plugin_count != 0) {
    lVar4 = 0;
    cVar2 = '\0';
    uVar5 = 0;
    pfVar3 = fsnav;
    do {
      pfVar1 = (pfVar3->core).plugins;
      if (*(_func_void **)((long)&pfVar1->func + lVar4) == oldplugin) {
        *(_func_void **)((long)&pfVar1->func + lVar4) = newplugin;
        cVar2 = '\x01';
        pfVar3 = fsnav;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (pfVar3->core).plugin_count);
    return cVar2;
  }
  return '\0';
}

Assistant:

char fsnav_replace_plugin(void(*oldplugin)(void), void(*newplugin)(void))
{
	size_t i;
	char flag;

	for (i = 0, flag = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func != oldplugin)
			continue;
		fsnav->core.plugins[i].func = newplugin;
		flag = 1;
	}

	return flag;
}